

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall
Lowerer::LowerBailoutCheckAndLabel(Lowerer *this,Instr *instr,bool onEqual,bool isHelper)

{
  Instr *this_00;
  code *pcVar1;
  IRKind IVar2;
  bool bVar3;
  IRType type;
  OpCode OVar4;
  BailOutKind BVar5;
  undefined4 *puVar6;
  Opnd *pOVar7;
  Opnd *pOVar8;
  IntConstOpnd *pIVar9;
  long lVar10;
  LabelInstr *instr_00;
  bool local_41;
  LabelInstr *helperLabelInstr;
  Instr *instrNext;
  LabelInstr *continueLabelInstr;
  bool isHelper_local;
  bool onEqual_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  this_00 = instr->m_next;
  IVar2 = IR::Instr::GetKind(this_00);
  local_41 = true;
  if (IVar2 != InstrKindLabel) {
    local_41 = IR::Instr::IsProfiledLabelInstr(this_00);
  }
  if (local_41 == false) {
    instrNext = &IR::LabelInstr::New(Label,this->m_func,isHelper)->super_Instr;
    IR::Instr::InsertAfter(instr,instrNext);
  }
  else {
    instrNext = &IR::Instr::AsLabelInstr(this_00)->super_Instr;
  }
  BVar5 = IR::Instr::GetBailOutKind(instr);
  if (BVar5 == BailOutInjected) {
    if (!onEqual) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x315d,"(onEqual)","onEqual");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pOVar7 = IR::Instr::GetSrc1(instr);
    pOVar8 = IR::Instr::GetSrc2(instr);
    bVar3 = IR::Opnd::IsEqual(pOVar7,pOVar8);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x315e,"(instr->GetSrc1()->IsEqual(instr->GetSrc2()))",
                         "instr->GetSrc1()->IsEqual(instr->GetSrc2())");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pOVar7 = IR::Instr::GetSrc1(instr);
    pIVar9 = IR::Opnd::AsIntConstOpnd(pOVar7);
    lVar10 = IR::EncodableOpnd<long>::GetValue(&pIVar9->super_EncodableOpnd<long>);
    if (lVar10 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x315f,"(instr->GetSrc1()->AsIntConstOpnd()->GetValue() == 0)",
                         "instr->GetSrc1()->AsIntConstOpnd()->GetValue() == 0");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pOVar7 = IR::Instr::GetSrc1(instr);
    type = IR::Opnd::GetType(pOVar7);
    OVar4 = LowererMD::GetLoadOp(type);
    IR::Instr::HoistSrc1(instr,OVar4,RegNOREG,(StackSym *)0x0);
  }
  pOVar7 = IR::Instr::UnlinkSrc1(instr);
  pOVar8 = IR::Instr::UnlinkSrc2(instr);
  OVar4 = BrEq_A;
  if (onEqual) {
    OVar4 = BrNeq_A;
  }
  InsertCompareBranch(this,pOVar7,pOVar8,OVar4,(LabelInstr *)instrNext,instr,false);
  if (!isHelper) {
    instr_00 = IR::LabelInstr::New(Label,this->m_func,true);
    IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
    (instr_00->super_Instr).m_noLazyHelperAssert = true;
  }
  return;
}

Assistant:

void
Lowerer::LowerBailoutCheckAndLabel(IR::Instr *instr, bool onEqual, bool isHelper)
{
    // Label to skip Bailout and continue
    IR::LabelInstr * continueLabelInstr;
    IR::Instr *instrNext = instr->m_next;
    if (instrNext->IsLabelInstr())
    {
        continueLabelInstr = instrNext->AsLabelInstr();
    }
    else
    {
        continueLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, isHelper);
        instr->InsertAfter(continueLabelInstr);
    }

    if(instr->GetBailOutKind() == IR::BailOutInjected)
    {
        // BailOnEqual 0, 0
        Assert(onEqual);
        Assert(instr->GetSrc1()->IsEqual(instr->GetSrc2()));
        Assert(instr->GetSrc1()->AsIntConstOpnd()->GetValue() == 0);

        // The operands cannot be equal when generating a compare (assert) but since this is for testing purposes, hoist a src.
        // Ideally, we would just create a BailOut instruction that generates a guaranteed bailout, but there seem to be issues
        // with doing this in a non-helper path. So finally, it would generate:
        //     xor s0, s0
        //     test s0, s0
        //     jnz $continue
        //   $bailout:
        //     // bailout
        //   $continue:
        instr->HoistSrc1(LowererMD::GetLoadOp(instr->GetSrc1()->GetType()));
    }

    InsertCompareBranch(instr->UnlinkSrc1(), instr->UnlinkSrc2(),
        onEqual ? Js::OpCode::BrNeq_A : Js::OpCode::BrEq_A, continueLabelInstr, instr);

    if (!isHelper)
    {
        IR::LabelInstr * helperLabelInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func, true);
        instr->InsertBefore(helperLabelInstr);
#if DBG
        helperLabelInstr->m_noLazyHelperAssert = true;
#endif
    }
}